

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_filters_4tap(int16_t *filter,__m256i *f)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 (*in_RSI) [32];
  __m256i coeff;
  __m128i h;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  auVar1._8_8_ = uStack_28;
  auVar1._0_8_ = uStack_30;
  auVar1._16_8_ = uStack_30;
  auVar1._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar1,0x55);
  *in_RSI = auVar1;
  auVar2._8_8_ = uStack_28;
  auVar2._0_8_ = uStack_30;
  auVar2._16_8_ = uStack_30;
  auVar2._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar2,0xaa);
  in_RSI[1] = auVar1;
  return;
}

Assistant:

static inline void pack_filters_4tap(const int16_t *filter,
                                     __m256i *f /*f[4]*/) {
  const __m128i h = _mm_loadu_si128((const __m128i *)filter);
  const __m256i coeff = _mm256_broadcastsi128_si256(h);

  // coeffs 2 3 2 3 2 3 2 3
  f[0] = _mm256_shuffle_epi32(coeff, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  f[1] = _mm256_shuffle_epi32(coeff, 0xaa);
}